

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

void pnga_copy_patch(char *trans,Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,
                    Integer *bhi)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char **grp;
  Integer *grp_00;
  Integer IVar4;
  Integer IVar5;
  logical lVar6;
  Integer IVar7;
  Integer IVar8;
  undefined8 *puVar9;
  long lVar10;
  char **ppcVar11;
  Integer *pIVar12;
  Integer *in_RCX;
  undefined8 *puVar13;
  Integer *in_RDX;
  Integer in_RSI;
  char *in_RDI;
  Integer in_R8;
  Integer *in_R9;
  Integer *in_stack_00000008;
  _iterator_hdl hdl_b;
  _iterator_hdl hdl_a;
  Integer jtot;
  Integer last;
  Integer offset;
  int local_sync_end;
  int local_sync_begin;
  int has_intersection;
  int use_put;
  Integer num_blocks_b;
  Integer num_blocks_a;
  Integer bnproc;
  Integer anproc;
  Integer b_grp;
  Integer a_grp;
  Integer me_b;
  Integer me_a;
  Integer base;
  Integer factor_data [7];
  Integer factor_idx2 [7];
  Integer factor_idx1 [7];
  Integer bunit [7];
  Integer bvalue [7];
  Integer *dst_idx_ptr;
  Integer *src_idx_ptr;
  char *tmp_ptr;
  char *src_data_ptr;
  Integer bld [7];
  Integer ald [7];
  Integer ld [7];
  Integer hid [7];
  Integer lod [7];
  Integer his [7];
  Integer los [7];
  Integer btotal;
  Integer atotal;
  Integer nelem;
  Integer bdims [7];
  Integer bndim;
  Integer adims [7];
  Integer andim;
  Integer btype;
  Integer atype;
  Integer factor;
  Integer idx;
  Integer j;
  Integer i;
  Integer *in_stack_fffffffffffff530;
  void *in_stack_fffffffffffff538;
  Integer *in_stack_fffffffffffff540;
  Integer *in_stack_fffffffffffff548;
  Integer in_stack_fffffffffffff550;
  Integer *in_stack_fffffffffffff568;
  char **in_stack_fffffffffffff570;
  Integer *in_stack_fffffffffffff578;
  Integer *in_stack_fffffffffffff580;
  _iterator_hdl *in_stack_fffffffffffff588;
  _iterator_hdl *in_stack_fffffffffffff5f8;
  Integer in_stack_fffffffffffff600;
  Integer in_stack_fffffffffffff6c8;
  char *in_stack_fffffffffffff6d0;
  Integer *in_stack_fffffffffffff6e0;
  void *in_stack_fffffffffffff6e8;
  Integer *in_stack_fffffffffffff6f0;
  Integer *in_stack_fffffffffffff6f8;
  Integer in_stack_fffffffffffff700;
  Integer *in_stack_fffffffffffff738;
  Integer *in_stack_fffffffffffff740;
  Integer *in_stack_fffffffffffff748;
  void *in_stack_fffffffffffff750;
  void *in_stack_fffffffffffff758;
  Integer in_stack_fffffffffffff760;
  Integer *in_stack_fffffffffffff838;
  Integer *in_stack_fffffffffffff840;
  Integer in_stack_fffffffffffff848;
  Integer in_stack_fffffffffffff850;
  Integer *in_stack_fffffffffffff910;
  void *in_stack_fffffffffffff918;
  Integer *in_stack_fffffffffffff920;
  Integer *in_stack_fffffffffffff928;
  Integer in_stack_fffffffffffff930;
  long local_488;
  long local_478;
  int local_468;
  long local_420;
  long local_418 [8];
  long alStack_3d8 [8];
  long local_398 [8];
  long alStack_358 [8];
  Integer aIStack_318 [8];
  void *local_2d8;
  void *local_2d0;
  void *local_2c8;
  long local_2c0;
  Integer local_2b8;
  long local_2b0 [7];
  Integer local_278;
  long local_270 [7];
  long local_238 [8];
  Integer local_1f8 [8];
  Integer local_1b8 [8];
  Integer local_178 [8];
  Integer local_138 [7];
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8 [7];
  Integer local_b0;
  long local_a8 [8];
  Integer local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  Integer *local_30;
  Integer local_28;
  Integer *local_20;
  Integer *local_18;
  Integer local_10;
  char *local_8;
  
  iVar2 = _ga_sync_end;
  iVar3 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  grp = (char **)pnga_get_pgroup(in_RSI);
  grp_00 = (Integer *)pnga_get_pgroup(local_28);
  pnga_pgroup_nodeid((Integer)grp);
  pnga_pgroup_nodeid((Integer)grp_00);
  IVar4 = pnga_get_pgroup_size((Integer)grp);
  IVar5 = pnga_get_pgroup_size((Integer)grp_00);
  bVar1 = IVar5 < IVar4;
  if (iVar3 != 0) {
    if (IVar5 < IVar4) {
      in_stack_fffffffffffff570 = grp;
      ppcVar11 = (char **)pnga_pgroup_get_world();
      if ((in_stack_fffffffffffff570 == ppcVar11) &&
         (in_stack_fffffffffffff568 = grp_00, pIVar12 = (Integer *)pnga_pgroup_get_world(),
         in_stack_fffffffffffff568 == pIVar12)) {
        pnga_sync();
      }
      else {
        pnga_pgroup_sync((Integer)in_stack_fffffffffffff530);
      }
    }
    else {
      pnga_pgroup_sync((Integer)in_stack_fffffffffffff530);
    }
  }
  pnga_inquire((Integer)in_stack_fffffffffffff750,in_stack_fffffffffffff748,
               in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  pnga_inquire((Integer)in_stack_fffffffffffff750,in_stack_fffffffffffff748,
               in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  if (local_10 == local_28) {
    lVar6 = pnga_comp_patch(local_68,local_18,local_20,local_b0,local_30,in_stack_00000008);
    if (lVar6 != 0) {
      return;
    }
    lVar6 = pnga_patch_intersect(local_18,local_20,local_30,in_stack_00000008,local_68);
    if (lVar6 != 0) {
      pnga_error(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    }
  }
  if (local_58 != local_60) {
    pnga_error(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  }
  for (local_38 = 0; local_38 < local_68; local_38 = local_38 + 1) {
    if ((local_18[local_38] < 1) || (local_a8[local_38] < local_20[local_38])) {
      pnga_error(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    }
  }
  for (local_38 = 0; local_38 < local_b0; local_38 = local_38 + 1) {
    if ((local_30[local_38] < 1) || (local_e8[local_38] < in_stack_00000008[local_38])) {
      pnga_error(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    }
  }
  local_f8 = 1;
  local_100 = 1;
  for (local_38 = 0; local_38 < local_68; local_38 = local_38 + 1) {
    local_f8 = ((local_20[local_38] - local_18[local_38]) + 1) * local_f8;
  }
  for (local_38 = 0; local_38 < local_b0; local_38 = local_38 + 1) {
    local_100 = ((in_stack_00000008[local_38] - local_30[local_38]) + 1) * local_100;
  }
  if (local_f8 != local_100) {
    pnga_error(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  }
  IVar7 = pnga_total_blocks(local_10);
  IVar8 = pnga_total_blocks(local_28);
  if ((-1 < IVar7) || (-1 < IVar8)) {
    if ((*local_8 != 'n') && (*local_8 != 'N')) {
      pnga_error(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    }
    lVar6 = snga_test_shape(local_18,local_20,local_30,in_stack_00000008,local_68,local_b0);
    if (lVar6 == 0) {
      pnga_error(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
    }
  }
  if ((IVar7 < 0) && (IVar8 < 0)) {
    if (bVar1) {
      pnga_distribution(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                        in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      lVar6 = pnga_patch_intersect(local_30,in_stack_00000008,local_138,local_178,local_b0);
      local_468 = (int)lVar6;
    }
    else {
      pnga_distribution(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                        in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      lVar6 = pnga_patch_intersect(local_18,local_20,local_138,local_178,local_68);
      local_468 = (int)lVar6;
    }
    if (local_468 != 0) {
      if (bVar1) {
        pnga_access_ptr(in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                        in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                        in_stack_fffffffffffff910);
      }
      else {
        pnga_access_ptr(in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                        in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                        in_stack_fffffffffffff910);
      }
      local_f0 = 1;
      for (local_38 = 0; local_38 < local_68; local_38 = local_38 + 1) {
        local_f0 = ((local_178[local_38] - local_138[local_38]) + 1) * local_f0;
      }
      for (local_38 = 0; local_38 < local_68; local_38 = local_38 + 1) {
        local_270[local_38 + -1] = (local_20[local_38] - local_18[local_38]) + 1;
      }
      for (local_38 = 0; local_38 < local_b0; local_38 = local_38 + 1) {
        local_2b0[local_38 + -1] = (in_stack_00000008[local_38] - local_30[local_38]) + 1;
      }
      local_420 = 0;
      local_50 = 1;
      for (local_38 = 0; local_38 < local_68; local_38 = local_38 + 1) {
        local_420 = local_138[local_38] * local_50 + local_420;
        local_50 = local_238[local_38] * local_50;
      }
      if (((*local_8 == 'n') || (*local_8 == 'N')) &&
         (lVar6 = snga_test_shape(local_18,local_20,local_30,in_stack_00000008,local_68,local_b0),
         lVar6 != 0)) {
        if (bVar1) {
          snga_dest_indices(local_b0,local_138,local_30,&local_2b8,local_68,local_1b8,local_18,
                            &local_278);
          in_stack_fffffffffffff530 = &local_278;
          snga_dest_indices(local_b0,local_178,local_30,&local_2b8,local_68,local_1f8,local_18,
                            in_stack_fffffffffffff530);
          pnga_get(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                   in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
          pnga_release(local_28,local_138,local_178);
        }
        else {
          snga_dest_indices(local_68,local_138,local_18,&local_278,local_b0,local_1b8,local_30,
                            &local_2b8);
          in_stack_fffffffffffff530 = &local_2b8;
          snga_dest_indices(local_68,local_178,local_18,&local_278,local_b0,local_1f8,local_30,
                            in_stack_fffffffffffff530);
          pnga_put(in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff540,
                   in_stack_fffffffffffff538,in_stack_fffffffffffff530);
          pnga_release(local_10,local_138,local_178);
        }
      }
      else {
        iVar3 = (int)((ulong)in_stack_fffffffffffff538 >> 0x20);
        if (bVar1) {
          local_2c8 = pnga_malloc((Integer)in_stack_fffffffffffff540,iVar3,
                                  (char *)in_stack_fffffffffffff530);
          local_2d0 = pnga_malloc((Integer)in_stack_fffffffffffff540,iVar3,
                                  (char *)in_stack_fffffffffffff530);
          local_2d8 = pnga_malloc((Integer)in_stack_fffffffffffff540,iVar3,
                                  (char *)in_stack_fffffffffffff530);
          for (local_38 = 0; local_38 < local_68; local_38 = local_38 + 1) {
            aIStack_318[local_38] = local_138[local_38];
            if (local_38 == 0) {
              alStack_358[0] = 1;
            }
            else {
              alStack_358[local_38] =
                   alStack_358[local_38 + -1] *
                   ((local_178[local_38 + -1] - local_138[local_38 + -1]) + 1);
            }
          }
          for (local_38 = 0; local_38 < local_f0; local_38 = local_38 + 1) {
            for (local_40 = 0; local_40 < local_b0; local_40 = local_40 + 1) {
              *(Integer *)((long)local_2d0 + (local_38 * local_b0 + local_40) * 8) =
                   aIStack_318[local_40];
              if ((local_38 + 1) % alStack_358[local_40] == 0) {
                aIStack_318[local_40] = aIStack_318[local_40] + 1;
              }
              if (local_178[local_40] < aIStack_318[local_40]) {
                aIStack_318[local_40] = local_138[local_40];
              }
            }
          }
          local_398[0] = 1;
          for (local_40 = 1; local_40 < local_b0; local_40 = local_40 + 1) {
            local_398[local_40] = local_398[local_40 + -1] * local_2b0[local_40 + -2];
          }
          alStack_3d8[local_b0 + -1] = 1;
          for (local_40 = local_b0 + -2; -1 < local_40; local_40 = local_40 + -1) {
            alStack_3d8[local_40] = local_398[local_40 + -7] * local_2b0[local_40];
          }
          local_418[0] = 1;
          for (local_40 = 1; local_40 < local_b0; local_40 = local_40 + 1) {
            local_418[local_40] = local_418[local_40 + -1] * local_238[local_40 + -1];
          }
          for (local_38 = 0; local_38 < local_f0; local_38 = local_38 + 1) {
            local_48 = 0;
            if ((*local_8 == 'n') || (*local_8 == 'N')) {
              for (local_40 = 0; local_40 < local_68; local_40 = local_40 + 1) {
                local_48 = (*(long *)((long)local_2d0 + (local_38 * local_b0 + local_40) * 8) -
                           local_30[local_40]) * local_398[local_40] + local_48;
              }
            }
            else {
              for (local_40 = local_68 + -1; -1 < local_40; local_40 = local_40 + -1) {
                local_48 = (*(long *)((long)local_2d0 + (local_38 * local_b0 + local_40) * 8) -
                           local_30[local_40]) * alStack_3d8[local_40] + local_48;
              }
            }
            for (local_40 = 0; local_40 < local_68; local_40 = local_40 + 1) {
              *(long *)((long)local_2d8 + (local_38 * local_b0 + local_40) * 8) =
                   local_48 % local_270[local_40 + -1] + local_18[local_40];
              local_48 = local_48 / local_270[local_40 + -1];
            }
            local_48 = 0;
            for (local_40 = 0; local_40 < local_b0; local_40 = local_40 + 1) {
              local_48 = *(long *)((long)local_2d0 + (local_38 * local_b0 + local_40) * 8) *
                         local_418[local_40] + local_48;
            }
            local_48 = local_48 - local_420;
            switch(local_58) {
            case 0x3e9:
              *(undefined4 *)((long)local_2c8 + local_38 * 4) =
                   *(undefined4 *)(local_2c0 + local_48 * 4);
              break;
            case 0x3ea:
              *(undefined8 *)((long)local_2c8 + local_38 * 8) =
                   *(undefined8 *)(local_2c0 + local_48 * 8);
              break;
            case 0x3eb:
              *(undefined4 *)((long)local_2c8 + local_38 * 4) =
                   *(undefined4 *)(local_2c0 + local_48 * 4);
              break;
            case 0x3ec:
              *(undefined8 *)((long)local_2c8 + local_38 * 8) =
                   *(undefined8 *)(local_2c0 + local_48 * 8);
              break;
            case 0x3ee:
              *(undefined8 *)((long)local_2c8 + local_38 * 8) =
                   *(undefined8 *)(local_2c0 + local_48 * 8);
              break;
            case 0x3ef:
              puVar9 = (undefined8 *)((long)local_2c8 + local_38 * 0x10);
              puVar13 = (undefined8 *)(local_2c0 + local_48 * 0x10);
              *puVar9 = *puVar13;
              puVar9[1] = puVar13[1];
              break;
            case 0x3f8:
              *(undefined8 *)((long)local_2c8 + local_38 * 8) =
                   *(undefined8 *)(local_2c0 + local_48 * 8);
            }
          }
          pnga_release(local_28,local_138,local_178);
          pnga_gather(in_stack_fffffffffffff760,in_stack_fffffffffffff758,in_stack_fffffffffffff750,
                      (Integer)in_stack_fffffffffffff748,(Integer)in_stack_fffffffffffff740);
          pnga_free((void *)0x1d60fd);
          pnga_free((void *)0x1d610a);
          pnga_free((void *)0x1d6117);
        }
        else {
          local_2c8 = pnga_malloc((Integer)in_stack_fffffffffffff540,iVar3,
                                  (char *)in_stack_fffffffffffff530);
          local_2d0 = pnga_malloc((Integer)in_stack_fffffffffffff540,iVar3,
                                  (char *)in_stack_fffffffffffff530);
          local_2d8 = pnga_malloc((Integer)in_stack_fffffffffffff540,iVar3,
                                  (char *)in_stack_fffffffffffff530);
          for (local_38 = 0; local_38 < local_68; local_38 = local_38 + 1) {
            aIStack_318[local_38] = local_138[local_38];
            if (local_38 == 0) {
              alStack_358[0] = 1;
            }
            else {
              alStack_358[local_38] =
                   alStack_358[local_38 + -1] *
                   ((local_178[local_38 + -1] - local_138[local_38 + -1]) + 1);
            }
          }
          for (local_38 = 0; local_38 < local_f0; local_38 = local_38 + 1) {
            for (local_40 = 0; local_40 < local_68; local_40 = local_40 + 1) {
              *(Integer *)((long)local_2d0 + (local_38 * local_68 + local_40) * 8) =
                   aIStack_318[local_40];
              if ((local_38 + 1) % alStack_358[local_40] == 0) {
                aIStack_318[local_40] = aIStack_318[local_40] + 1;
              }
              if (local_178[local_40] < aIStack_318[local_40]) {
                aIStack_318[local_40] = local_138[local_40];
              }
            }
          }
          local_398[0] = 1;
          for (local_40 = 1; local_40 < local_68; local_40 = local_40 + 1) {
            local_398[local_40] = local_398[local_40 + -1] * local_270[local_40 + -2];
          }
          alStack_3d8[local_68 + -1] = 1;
          for (local_40 = local_68 + -2; -1 < local_40; local_40 = local_40 + -1) {
            alStack_3d8[local_40] = local_398[local_40 + -7] * local_238[local_40 + -7];
          }
          local_418[0] = 1;
          for (local_40 = 1; local_40 < local_68; local_40 = local_40 + 1) {
            local_418[local_40] = local_418[local_40 + -1] * local_238[local_40 + -1];
          }
          for (local_38 = 0; local_38 < local_f0; local_38 = local_38 + 1) {
            local_48 = 0;
            if ((*local_8 == 'n') || (*local_8 == 'N')) {
              for (local_40 = 0; local_40 < local_68; local_40 = local_40 + 1) {
                local_48 = (*(long *)((long)local_2d0 + (local_38 * local_68 + local_40) * 8) -
                           local_18[local_40]) * local_398[local_40] + local_48;
              }
            }
            else {
              for (local_40 = local_68 + -1; -1 < local_40; local_40 = local_40 + -1) {
                local_48 = (*(long *)((long)local_2d0 + (local_38 * local_68 + local_40) * 8) -
                           local_18[local_40]) * alStack_3d8[local_40] + local_48;
              }
            }
            for (local_40 = 0; local_40 < local_b0; local_40 = local_40 + 1) {
              *(long *)((long)local_2d8 + (local_38 * local_b0 + local_40) * 8) =
                   local_48 % local_2b0[local_40 + -1] + local_30[local_40];
              local_48 = local_48 / local_2b0[local_40 + -1];
            }
            local_48 = 0;
            for (local_40 = 0; local_40 < local_68; local_40 = local_40 + 1) {
              local_48 = *(long *)((long)local_2d0 + (local_38 * local_68 + local_40) * 8) *
                         local_418[local_40] + local_48;
            }
            local_48 = local_48 - local_420;
            switch(local_58) {
            case 0x3e9:
              *(undefined4 *)((long)local_2c8 + local_38 * 4) =
                   *(undefined4 *)(local_2c0 + local_48 * 4);
              break;
            case 0x3ea:
              *(undefined8 *)((long)local_2c8 + local_38 * 8) =
                   *(undefined8 *)(local_2c0 + local_48 * 8);
              break;
            case 0x3eb:
              *(undefined4 *)((long)local_2c8 + local_38 * 4) =
                   *(undefined4 *)(local_2c0 + local_48 * 4);
              break;
            case 0x3ec:
              *(undefined8 *)((long)local_2c8 + local_38 * 8) =
                   *(undefined8 *)(local_2c0 + local_48 * 8);
              break;
            case 0x3ee:
              *(undefined8 *)((long)local_2c8 + local_38 * 8) =
                   *(undefined8 *)(local_2c0 + local_48 * 8);
              break;
            case 0x3ef:
              puVar9 = (undefined8 *)((long)local_2c8 + local_38 * 0x10);
              puVar13 = (undefined8 *)(local_2c0 + local_48 * 0x10);
              *puVar9 = *puVar13;
              puVar9[1] = puVar13[1];
              break;
            case 0x3f8:
              *(undefined8 *)((long)local_2c8 + local_38 * 8) =
                   *(undefined8 *)(local_2c0 + local_48 * 8);
            }
          }
          pnga_release(local_10,local_138,local_178);
          pnga_scatter(in_stack_fffffffffffff760,in_stack_fffffffffffff758,in_stack_fffffffffffff750
                       ,(Integer)in_stack_fffffffffffff748,(Integer)in_stack_fffffffffffff740);
          pnga_free((void *)0x1d583d);
          pnga_free((void *)0x1d584a);
          pnga_free((void *)0x1d5857);
        }
      }
    }
  }
  else {
    for (local_38 = 0; local_38 < local_68; local_38 = local_38 + 1) {
      local_270[local_38 + -1] = (local_20[local_38] - local_18[local_38]) + 1;
    }
    for (local_38 = 0; local_38 < local_b0; local_38 = local_38 + 1) {
      local_2b0[local_38 + -1] = (in_stack_00000008[local_38] - local_30[local_38]) + 1;
    }
    if (bVar1) {
      if (IVar8 < 0) {
        pnga_distribution(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                          in_stack_fffffffffffff840,in_stack_fffffffffffff838);
        lVar6 = pnga_patch_intersect(local_30,in_stack_00000008,local_138,local_178,local_b0);
        if (lVar6 != 0) {
          pnga_access_ptr(in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                          in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                          in_stack_fffffffffffff910);
          snga_dest_indices(local_b0,local_138,local_30,&local_2b8,local_68,local_1b8,local_18,
                            &local_278);
          in_stack_fffffffffffff530 = &local_278;
          snga_dest_indices(local_b0,local_178,local_30,&local_2b8,local_68,local_1f8,local_18,
                            in_stack_fffffffffffff530);
          pnga_get(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                   in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
          pnga_release(local_28,local_138,local_178);
        }
      }
      else {
        pnga_local_iterator_init(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
        while (iVar3 = pnga_local_iterator_next
                                 (in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                                  in_stack_fffffffffffff578,in_stack_fffffffffffff570,
                                  in_stack_fffffffffffff568), iVar3 != 0) {
          for (local_40 = 0; local_40 < local_68; local_40 = local_40 + 1) {
            local_1b8[local_40] = local_138[local_40];
            local_1f8[local_40] = local_178[local_40];
          }
          lVar6 = pnga_patch_intersect(local_30,in_stack_00000008,local_138,local_178,local_68);
          if (lVar6 != 0) {
            local_478 = 0;
            lVar10 = local_68 + -1;
            local_488 = 1;
            for (local_40 = 0; local_40 < lVar10; local_40 = local_40 + 1) {
              local_478 = (local_138[local_40] - local_1b8[local_40]) * local_488 + local_478;
              local_488 = local_238[local_40] * local_488;
            }
            local_478 = local_478 + (local_138[lVar10] - local_1b8[lVar10]) * local_488;
            switch(local_58) {
            case 0x3e9:
              local_2c0 = local_2c0 + local_478 * 4;
              break;
            case 0x3ea:
              local_2c0 = local_2c0 + local_478 * 8;
              break;
            case 0x3eb:
              local_2c0 = local_2c0 + local_478 * 4;
              break;
            case 0x3ec:
              local_2c0 = local_2c0 + local_478 * 8;
              break;
            default:
              break;
            case 0x3ee:
              local_2c0 = local_2c0 + local_478 * 8;
              break;
            case 0x3ef:
              local_2c0 = local_2c0 + local_478 * 0x10;
              break;
            case 0x3f8:
              local_2c0 = local_2c0 + local_478 * 8;
            }
            snga_dest_indices(local_b0,local_138,local_30,&local_2b8,local_68,local_1b8,local_18,
                              &local_278);
            in_stack_fffffffffffff530 = &local_278;
            snga_dest_indices(local_b0,local_178,local_30,&local_2b8,local_68,local_1f8,local_18,
                              in_stack_fffffffffffff530);
            pnga_get(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                     in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
            pnga_release_block(local_28,local_38);
          }
        }
      }
    }
    else if (IVar7 < 0) {
      pnga_distribution(in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                        in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      lVar6 = pnga_patch_intersect(local_18,local_20,local_138,local_178,local_68);
      if (lVar6 != 0) {
        pnga_access_ptr(in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                        in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                        in_stack_fffffffffffff910);
        snga_dest_indices(local_68,local_138,local_18,&local_278,local_b0,local_1b8,local_30,
                          &local_2b8);
        in_stack_fffffffffffff530 = &local_2b8;
        snga_dest_indices(local_68,local_178,local_18,&local_278,local_b0,local_1f8,local_30,
                          in_stack_fffffffffffff530);
        pnga_put(in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff540,
                 in_stack_fffffffffffff538,in_stack_fffffffffffff530);
        pnga_release(local_10,local_138,local_178);
      }
    }
    else {
      pnga_local_iterator_init(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      while (iVar3 = pnga_local_iterator_next
                               (in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                                in_stack_fffffffffffff578,in_stack_fffffffffffff570,
                                in_stack_fffffffffffff568), iVar3 != 0) {
        for (local_40 = 0; local_40 < local_68; local_40 = local_40 + 1) {
          local_1b8[local_40] = local_138[local_40];
          local_1f8[local_40] = local_178[local_40];
        }
        lVar6 = pnga_patch_intersect(local_18,local_20,local_138,local_178,local_68);
        if (lVar6 != 0) {
          local_478 = 0;
          lVar10 = local_68 + -1;
          local_488 = 1;
          for (local_40 = 0; local_40 < lVar10; local_40 = local_40 + 1) {
            local_478 = (local_138[local_40] - local_1b8[local_40]) * local_488 + local_478;
            local_488 = local_238[local_40] * local_488;
          }
          local_478 = local_478 + (local_138[lVar10] - local_1b8[lVar10]) * local_488;
          lVar10 = local_58 + -0x3e9;
          switch(lVar10) {
          case 0:
            local_2c0 = local_2c0 + local_478 * 4;
            break;
          case 1:
            local_2c0 = local_2c0 + local_478 * 8;
            break;
          case 2:
            local_2c0 = local_2c0 + local_478 * 4;
            break;
          case 3:
            local_2c0 = local_2c0 + local_478 * 8;
            break;
          default:
            break;
          case 5:
            local_2c0 = local_2c0 + local_478 * 8;
            break;
          case 6:
            local_2c0 = local_2c0 + local_478 * 0x10;
            break;
          case 0xf:
            local_2c0 = local_2c0 + local_478 * 8;
          }
          snga_dest_indices(local_68,local_138,local_18,&local_278,local_b0,local_1b8,local_30,
                            &local_2b8);
          in_stack_fffffffffffff530 = &local_2b8;
          snga_dest_indices(local_68,local_178,local_18,&local_278,local_b0,local_1f8,local_30,
                            in_stack_fffffffffffff530);
          pnga_put(lVar10,in_stack_fffffffffffff548,in_stack_fffffffffffff540,
                   in_stack_fffffffffffff538,in_stack_fffffffffffff530);
          pnga_release_block(local_10,local_38);
        }
      }
    }
  }
  if (iVar2 != 0) {
    if (IVar5 < IVar4) {
      ppcVar11 = (char **)pnga_pgroup_get_world();
      if ((grp == ppcVar11) && (pIVar12 = (Integer *)pnga_pgroup_get_world(), grp_00 == pIVar12)) {
        pnga_sync();
      }
      else {
        pnga_pgroup_sync((Integer)in_stack_fffffffffffff530);
      }
    }
    else {
      pnga_pgroup_sync((Integer)in_stack_fffffffffffff530);
    }
  }
  return;
}

Assistant:

void pnga_copy_patch(char *trans,
                    Integer g_a, Integer *alo, Integer *ahi,
                    Integer g_b, Integer *blo, Integer *bhi)
{
  Integer i, j;
  Integer idx, factor;
  Integer atype, btype, andim, adims[MAXDIM], bndim, bdims[MAXDIM];
  Integer nelem;
  Integer atotal, btotal;
  Integer los[MAXDIM], his[MAXDIM];
  Integer lod[MAXDIM], hid[MAXDIM];
  Integer ld[MAXDIM], ald[MAXDIM], bld[MAXDIM];
  char *src_data_ptr, *tmp_ptr;
  Integer *src_idx_ptr, *dst_idx_ptr;
  Integer bvalue[MAXDIM], bunit[MAXDIM];
  Integer factor_idx1[MAXDIM], factor_idx2[MAXDIM], factor_data[MAXDIM];
  Integer base;
  Integer me_a, me_b;
  Integer a_grp, b_grp, anproc, bnproc;
  Integer num_blocks_a, num_blocks_b/*, chk*/;
  int use_put, has_intersection;
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  a_grp = pnga_get_pgroup(g_a);
  b_grp = pnga_get_pgroup(g_b);
  me_a = pnga_pgroup_nodeid(a_grp);
  me_b = pnga_pgroup_nodeid(b_grp);
  anproc = pnga_get_pgroup_size(a_grp);
  bnproc = pnga_get_pgroup_size(b_grp);
  if (anproc <= bnproc) {
    use_put = 1;
  }  else {
    use_put = 0;
  }

  /*if (a_grp != b_grp)
    pnga_error("All matrices must be on same group for pnga_copy_patch", 0L); */
  if(local_sync_begin) {
    if (anproc <= bnproc) {
      pnga_pgroup_sync(a_grp);
    } else if (a_grp == pnga_pgroup_get_world() &&
        b_grp == pnga_pgroup_get_world()) {
      pnga_sync();
    } else {
      pnga_pgroup_sync(b_grp);
    }
  }


  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);

  if(g_a == g_b) {
    /* they are the same patch */
    if(pnga_comp_patch(andim, alo, ahi, bndim, blo, bhi)) {
        return;
    /* they are in the same GA, but not the same patch */
    } else if (pnga_patch_intersect(alo, ahi, blo, bhi, andim)) {
      pnga_error("array patches cannot overlap ", 0L);
    }
  }

  if(atype != btype ) pnga_error("array type mismatch ", 0L);

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", 0L);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", 0L);

  /* check if numbers of elements in two patches match each other */
  atotal = 1; btotal = 1;
  for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);
  if(atotal != btotal)
    pnga_error("capacities two of patches do not match ", 0L);

  /* additional restrictions that apply if one or both arrays use
     block-cyclic data distributions */
  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  if (num_blocks_a >= 0 || num_blocks_b >= 0) {
    if (!(*trans == 'n' || *trans == 'N')) {
      pnga_error("Transpose option not supported for block-cyclic data", 0L);
    }
    if (!snga_test_shape(alo, ahi, blo, bhi, andim, bndim)) {
      pnga_error("Change in shape not supported for block-cyclic data", 0L);
    }
  }

  if (num_blocks_a < 0 && num_blocks_b <0) {
    /* now find out cordinates of a patch of g_a that I own */
    if (use_put) {
      pnga_distribution(g_a, me_a, los, his);
    } else {
      pnga_distribution(g_b, me_b, los, his);
    }

    /* copy my share of data */
    if (use_put) {
      has_intersection = pnga_patch_intersect(alo, ahi, los, his, andim);
    } else {
      has_intersection = pnga_patch_intersect(blo, bhi, los, his, bndim);
    }
    if(has_intersection){
      if (use_put) {
        pnga_access_ptr(g_a, los, his, &src_data_ptr, ld); 
      } else {
        pnga_access_ptr(g_b, los, his, &src_data_ptr, ld); 
      }

      /* calculate the number of elements in the patch that I own */
      nelem = 1; for(i=0; i<andim; i++) nelem *= (his[i] - los[i] + 1);

      for(i=0; i<andim; i++) ald[i] = ahi[i] - alo[i] + 1;
      for(i=0; i<bndim; i++) bld[i] = bhi[i] - blo[i] + 1;

      base = 0; factor = 1;
      for(i=0; i<andim; i++) {
        base += los[i] * factor;
        factor *= ld[i];
      }

      /*** straight copy possible if there's no reshaping or transpose ***/
      if((*trans == 'n' || *trans == 'N') &&
          snga_test_shape(alo, ahi, blo, bhi, andim, bndim)) { 
        /* find source[lo:hi] --> destination[lo:hi] */
        if (use_put) {
          snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
          snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
          pnga_put(g_b, lod, hid, src_data_ptr, ld);
          pnga_release(g_a, los, his);
        } else {
          snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
          snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
          pnga_get(g_a, lod, hid, src_data_ptr, ld);
          pnga_release(g_b, los, his);
        }
        /*** due to generality of this transformation scatter is required ***/
      } else{
        if (use_put) {
          tmp_ptr = pnga_malloc(nelem, atype, "v");
          src_idx_ptr = (Integer*) pnga_malloc((andim*nelem), MT_F_INT, "si");
          dst_idx_ptr = (Integer*) pnga_malloc((bndim*nelem), MT_F_INT, "di");

          /* calculate the destination indices */

          /* given los and his, find indices for each elements
           * bvalue: starting index in each dimension
           * bunit: stride in each dimension
           */
          for (i=0; i<andim; i++) {
            bvalue[i] = los[i];
            if (i == 0) bunit[i] = 1;
            else bunit[i] = bunit[i-1] * (his[i-1] - los[i-1] + 1);
          }

          /* source indices */
          for (i=0; i<nelem; i++) {
            for (j=0; j<andim; j++){
              src_idx_ptr[i*andim+j] = bvalue[j];
              /* if the next element is the first element in
               * one dimension, increment the index by 1
               */
              if (((i+1) % bunit[j]) == 0) bvalue[j]++;
              /* if the index becomes larger than the upper
               * bound in one dimension, reset it.
               */
              if(bvalue[j] > his[j]) bvalue[j] = los[j];
            }
          }

          /* index factor: reshaping without transpose */
          factor_idx1[0] = 1;
          for (j=1; j<andim; j++) 
            factor_idx1[j] = factor_idx1[j-1] * ald[j-1];

          /* index factor: reshaping with transpose */
          factor_idx2[andim-1] = 1;
          for (j=(andim-1)-1; j>=0; j--)
            factor_idx2[j] = factor_idx2[j+1] * ald[j+1];

          /* data factor */
          factor_data[0] = 1;
          for (j=1; j<andim; j++) 
            factor_data[j] = factor_data[j-1] * ld[j-1];

          /* destination indices */
          for(i=0; i<nelem; i++) {
            /* linearize the n-dimensional indices to one dimension */
            idx = 0;
            if (*trans == 'n' || *trans == 'N')
              for (j=0; j<andim; j++) 
                idx += (src_idx_ptr[i*andim+j] - alo[j]) *
                  factor_idx1[j];
            else
              /* if the patch needs to be transposed, reverse
               * the indices: (i, j, ...) -> (..., j, i)
               */
              for (j=(andim-1); j>=0; j--) 
                idx += (src_idx_ptr[i*andim+j] - alo[j]) *
                  factor_idx2[j];

            /* convert the one dimensional index to n-dimensional
             * indices of destination
             */
            for (j=0; j<bndim; j++) {
              dst_idx_ptr[i*bndim+j] = idx % bld[j] + blo[j]; 
              idx /= bld[j];
            }

            /* move the data block to create a new block */
            /* linearize the data indices */
            idx = 0;
            for (j=0; j<andim; j++) 
              idx += (src_idx_ptr[i*andim+j]) * factor_data[j];

            /* adjust the position
             * base: starting address of the first element */
            idx -= base;

            /* move the element to the temporary location */
            switch(atype) {
              case C_DBL: ((double*)tmp_ptr)[i] =
                          ((double*)src_data_ptr)[idx]; 
                          break;
              case C_INT:
                          ((int *)tmp_ptr)[i] = ((int *)src_data_ptr)[idx];
                          break;
              case C_DCPL:((DoubleComplex *)tmp_ptr)[i] =
                          ((DoubleComplex *)src_data_ptr)[idx];
                          break;
              case C_SCPL:((SingleComplex *)tmp_ptr)[i] =
                          ((SingleComplex *)src_data_ptr)[idx];
                          break;
              case C_FLOAT: ((float *)tmp_ptr)[i] =
                            ((float *)src_data_ptr)[idx]; 
                          break;     
              case C_LONG: ((long *)tmp_ptr)[i] =
                           ((long *)src_data_ptr)[idx];
                          break;
              case C_LONGLONG: ((long long *)tmp_ptr)[i] =
                           ((long long *)src_data_ptr)[idx];     
            }
          }
          pnga_release(g_a, los, his);
          pnga_scatter(g_b, tmp_ptr, dst_idx_ptr, 0, nelem);
          pnga_free(dst_idx_ptr);
          pnga_free(src_idx_ptr);
          pnga_free(tmp_ptr);
        } else {
          tmp_ptr = pnga_malloc(nelem, atype, "v");
          src_idx_ptr = (Integer*) pnga_malloc((andim*nelem), MT_F_INT, "si");
          dst_idx_ptr = (Integer*) pnga_malloc((bndim*nelem), MT_F_INT, "di");

          /* calculate the destination indices */

          /* given los and his, find indices for each elements
           * bvalue: starting index in each dimension
           * bunit: stride in each dimension
           */
          for (i=0; i<andim; i++) {
            bvalue[i] = los[i];
            if (i == 0) bunit[i] = 1;
            else bunit[i] = bunit[i-1] * (his[i-1] - los[i-1] + 1);
          }

          /* destination indices */
          for (i=0; i<nelem; i++) {
            for (j=0; j<bndim; j++){
              src_idx_ptr[i*bndim+j] = bvalue[j];
              /* if the next element is the first element in
               * one dimension, increment the index by 1
               */
              if (((i+1) % bunit[j]) == 0) bvalue[j]++;
              /* if the index becomes larger than the upper
               * bound in one dimension, reset it.
               */
              if(bvalue[j] > his[j]) bvalue[j] = los[j];
            }
          }

          /* index factor: reshaping without transpose */
          factor_idx1[0] = 1;
          for (j=1; j<bndim; j++) 
            factor_idx1[j] = factor_idx1[j-1] * bld[j-1];

          /* index factor: reshaping with transpose */
          factor_idx2[bndim-1] = 1;
          for (j=(bndim-1)-1; j>=0; j--)
            factor_idx2[j] = factor_idx2[j+1] * bld[j+1];

          /* data factor */
          factor_data[0] = 1;
          for (j=1; j<bndim; j++) 
            factor_data[j] = factor_data[j-1] * ld[j-1];

          /* destination indices */
          for(i=0; i<nelem; i++) {
            /* linearize the n-dimensional indices to one dimension */
            idx = 0;
            if (*trans == 'n' || *trans == 'N')
              for (j=0; j<andim; j++) 
                idx += (src_idx_ptr[i*bndim+j] - blo[j]) *
                  factor_idx1[j];
            else
              /* if the patch needs to be transposed, reverse
               * the indices: (i, j, ...) -> (..., j, i)
               */
              for (j=(andim-1); j>=0; j--) 
                idx += (src_idx_ptr[i*bndim+j] - blo[j]) *
                  factor_idx2[j];

            /* convert the one dimensional index to n-dimensional
             * indices of destination
             */
            for (j=0; j<andim; j++) {
              dst_idx_ptr[i*bndim+j] = idx % ald[j] + alo[j]; 
              idx /= ald[j];
            }

            /* move the data block to create a new block */
            /* linearize the data indices */
            idx = 0;
            for (j=0; j<bndim; j++) 
              idx += (src_idx_ptr[i*bndim+j]) * factor_data[j];

            /* adjust the position
             * base: starting address of the first element */
            idx -= base;

            /* move the element to the temporary location */
            switch(atype) {
              case C_DBL: ((double*)tmp_ptr)[i] =
                          ((double*)src_data_ptr)[idx]; 
                          break;
              case C_INT:
                          ((int *)tmp_ptr)[i] = ((int *)src_data_ptr)[idx];
                          break;
              case C_DCPL:((DoubleComplex *)tmp_ptr)[i] =
                          ((DoubleComplex *)src_data_ptr)[idx];
                          break;
              case C_SCPL:((SingleComplex *)tmp_ptr)[i] =
                          ((SingleComplex *)src_data_ptr)[idx];
                          break;
              case C_FLOAT: ((float *)tmp_ptr)[i] =
                            ((float *)src_data_ptr)[idx]; 
                          break;
              case C_LONG: ((long *)tmp_ptr)[i] =
                           ((long *)src_data_ptr)[idx];     
                          break;
              case C_LONGLONG: ((long long *)tmp_ptr)[i] =
                           ((long long *)src_data_ptr)[idx];     
            }
          }
          pnga_release(g_b, los, his);
          pnga_gather(g_a, tmp_ptr, dst_idx_ptr, 0, nelem);
          pnga_free(dst_idx_ptr);
          pnga_free(src_idx_ptr);
          pnga_free(tmp_ptr);
        }
      }
    }
  } else {
    Integer offset, last, jtot;
    for (i=0; i<andim; i++) {
      ald[i] = ahi[i] - alo[i] + 1;
    }
    for (i=0; i<bndim; i++) {
      bld[i] = bhi[i] - blo[i] + 1;
    }
    if (use_put) {
      /* Array a is block-cyclic distributed */
      if (num_blocks_a >= 0) {
#if 1
        _iterator_hdl hdl_a;
        pnga_local_iterator_init(g_a, &hdl_a);
        while (pnga_local_iterator_next(&hdl_a, los, his,
              &src_data_ptr, ld)) {
            /* Copy limits since patch intersect modifies los array */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
              snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
              pnga_put(g_b, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_a, i);
            }
          }
#else
        /* Uses simple block-cyclic data distribution */
        if (!pnga_uses_proc_grid(g_a)) {
          for (i = me_a; i < num_blocks_a; i += anproc) {
            pnga_distribution(g_a, i, los, his); 
            /* make temporory copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
              pnga_access_block_ptr(g_a, i, &src_data_ptr, ld);
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
              snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
              pnga_put(g_b, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_a, i);
            }
          }
        } else {
          /* Uses scalapack block-cyclic data distribution */
          Integer proc_index[MAXDIM], index[MAXDIM];
          Integer topology[MAXDIM];
          Integer blocks[MAXDIM], block_dims[MAXDIM];
          pnga_get_proc_index(g_a, me_a, proc_index);
          pnga_get_proc_index(g_a, me_a, index);
          pnga_get_block_info(g_a, blocks, block_dims);
          pnga_get_proc_grid(g_a, topology);
          while (index[andim-1] < blocks[andim-1]) {
            /* find bounding coordinates of block */
            /*chk = 1;*/
            for (i = 0; i < andim; i++) {
              los[i] = index[i]*block_dims[i]+1;
              his[i] = (index[i] + 1)*block_dims[i];
              if (his[i] > adims[i]) his[i] = adims[i];
              /*if (his[i] < los[i]) chk = 0;*/
            }
            /* make temperary copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
              pnga_access_block_grid_ptr(g_a, index, &src_data_ptr, ld);
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
              snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
              pnga_put(g_b, lod, hid, src_data_ptr, ld);
              pnga_release_block_grid(g_a, index);
            }

            /* increment index to get next block on processor */
            index[0] += topology[0];
            for (i = 0; i < andim; i++) {
              if (index[i] >= blocks[i] && i<andim-1) {
                index[i] = proc_index[i];
                index[i+1] += topology[i+1];
              }
            }
          }
        }
#endif
      } else {
        /* Only array b is block-cyclic distributed */
        pnga_distribution(g_a, me_a, los, his); 
        if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
          pnga_access_ptr(g_a, los, his, &src_data_ptr, ld); 
          snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
          snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
          pnga_put(g_b, lod, hid, src_data_ptr, ld);
          pnga_release(g_a, los, his);
        }
      }
    } else {
      /* Array b is block-cyclic distributed */
      if (num_blocks_b >= 0) {
#if 1
        _iterator_hdl hdl_b;
        pnga_local_iterator_init(g_b, &hdl_b);
        while (pnga_local_iterator_next(&hdl_b, los, his,
              &src_data_ptr, ld)) {
            /* Copy limits since patch intersect modifies los array */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(blo,bhi,los,his,andim)) {
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
              snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
              pnga_get(g_a, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_b, i);
            }
          }
#else
        /* Uses simple block-cyclic data distribution */
        if (!pnga_uses_proc_grid(g_b)) {
          for (i = me_b; i < num_blocks_b; i += bnproc) {
            pnga_distribution(g_b, i, los, his); 
            /* make temporory copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(blo,bhi,los,his,andim)) {
              pnga_access_block_ptr(g_b, i, &src_data_ptr, ld);
              offset = 0;
              last = bndim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
              snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
              pnga_get(g_a, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_b, i);
            }
          }
        } else {
          /* Uses scalapack block-cyclic data distribution */
          Integer proc_index[MAXDIM], index[MAXDIM];
          Integer topology[MAXDIM];
          Integer blocks[MAXDIM], block_dims[MAXDIM];
          pnga_get_proc_index(g_b, me_b, proc_index);
          pnga_get_proc_index(g_b, me_b, index);
          pnga_get_block_info(g_b, blocks, block_dims);
          pnga_get_proc_grid(g_b, topology);
          while (index[bndim-1] < blocks[bndim-1]) {
            /* find bounding coordinates of block */
            /*chk = 1;*/
            for (i = 0; i < bndim; i++) {
              los[i] = index[i]*block_dims[i]+1;
              his[i] = (index[i] + 1)*block_dims[i];
              if (his[i] > bdims[i]) his[i] = bdims[i];
              /*if (his[i] < los[i]) chk = 0;*/
            }
            /* make temporory copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(blo,bhi,los,his,andim)) {
              pnga_access_block_grid_ptr(g_b, index, &src_data_ptr, ld);
              offset = 0;
              last = bndim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
              snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
              pnga_get(g_a, lod, hid, src_data_ptr, ld);
              pnga_release_block_grid(g_b, index);
            }

            /* increment index to get next block on processor */
            index[0] += topology[0];
            for (i = 0; i < bndim; i++) {
              if (index[i] >= blocks[i] && i<bndim-1) {
                index[i] = proc_index[i];
                index[i+1] += topology[i+1];
              }
            }
          }
        }
#endif
      } else {
        /* Array a is block-cyclic distributed */
        pnga_distribution(g_b, me_b, los, his); 
        if (pnga_patch_intersect(blo,bhi,los,his,bndim)) {
          pnga_access_ptr(g_b, los, his, &src_data_ptr, ld); 
          snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
          snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
          pnga_get(g_a, lod, hid, src_data_ptr, ld);
          pnga_release(g_b, los, his);
        }
      }
    }
  }
  /* ARMCI_AllFence(); */
  if(local_sync_end) {
    if (anproc <= bnproc) {
      pnga_pgroup_sync(a_grp);
    } else if (a_grp == pnga_pgroup_get_world() &&
        b_grp == pnga_pgroup_get_world()) {
      pnga_sync();
    } else {
      pnga_pgroup_sync(b_grp);
    }
  }
}